

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLFormulasLinker.cpp
# Opt level: O0

int __thiscall COLLADASaxFWL::FormulasLinker::link(FormulasLinker *this,char *__from,char *__to)

{
  Formula *this_00;
  int iVar1;
  size_t sVar2;
  Formula **ppFVar3;
  MathmlAstArray *this_01;
  size_t sVar4;
  INode **ppIVar5;
  undefined4 extraout_var;
  bool success;
  INode **astNode;
  size_t j;
  size_t astsCount;
  MathmlAstArray *asts;
  Formula *formula;
  size_t i;
  size_t formulasCount;
  ulong local_40;
  size_t local_20;
  
  sVar2 = COLLADAFW::ArrayPrimitiveType<COLLADAFW::Formula_*>::getCount(this->mFormulas);
  for (local_20 = 0; local_20 < sVar2; local_20 = local_20 + 1) {
    ppFVar3 = COLLADAFW::ArrayPrimitiveType<COLLADAFW::Formula_*>::operator[]
                        (this->mFormulas,local_20);
    this_00 = *ppFVar3;
    this_01 = COLLADAFW::Formula::getMathmlAsts(this_00);
    sVar4 = COLLADAFW::ArrayPrimitiveType<MathML::AST::INode_*>::getCount(this_01);
    for (local_40 = 0; local_40 < sVar4; local_40 = local_40 + 1) {
      ppIVar5 = COLLADAFW::ArrayPrimitiveType<MathML::AST::INode_*>::operator[](this_01,local_40);
      iVar1 = link(this,(char *)this_00,(char *)*ppIVar5);
      *ppIVar5 = (INode *)CONCAT44(extraout_var,iVar1);
    }
  }
  return (int)CONCAT71((int7)(local_20 >> 8),1);
}

Assistant:

bool FormulasLinker::link()
	{
		size_t formulasCount = mFormulas.getCount();
		for ( size_t i = 0; i < formulasCount; ++i)
		{
			COLLADAFW::Formula* formula = mFormulas[i];
			COLLADAFW::MathmlAstArray& asts = formula->getMathmlAsts();
			size_t astsCount = asts.getCount();
			for ( size_t j = 0; j < astsCount; ++j)
			{
				MathML::AST::INode*& astNode =  asts[j];
				bool success = true;
				astNode = link( formula, astNode, success);
				if ( !success )
					return false;
			}
		}
		return true;
	}